

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void __thiscall
Function_Pool::FunctionTask::Threshold
          (FunctionTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,
          uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
          uint8_t maxThreshold)

{
  imageException *this_00;
  
  FunctionPoolTask::_setup
            (&this->super_FunctionPoolTask,in,startXIn,startYIn,out,startXOut,startYOut,width,height
            );
  if (minThreshold <= maxThreshold) {
    (this->_dataIn).minThreshold = minThreshold;
    (this->_dataIn).maxThreshold = maxThreshold;
    this->functionId = _ThresholdDouble;
    FunctionPoolTask::_processTask(&this->super_FunctionPoolTask);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this_00,"Minimum threshold value is bigger than maximum threshold value");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                        uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
        {
            _setup( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

            if( minThreshold > maxThreshold )
                throw imageException( "Minimum threshold value is bigger than maximum threshold value" );

            _dataIn.minThreshold = minThreshold;
            _dataIn.maxThreshold = maxThreshold;
            _process( _ThresholdDouble );
        }